

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void * db_compact_during_doc_delete(void *args)

{
  fdb_status fVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  ulong uVar2;
  char *__format;
  long lVar3;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  pthread_t tid;
  void *thread_ret;
  fdb_kvs_info kvs_info;
  fdb_kvs_config local_778;
  timeval __test_begin;
  fdb_config local_750;
  char metabuf [256];
  char keybuf [256];
  fdb_doc *apfStack_458 [100];
  char bodybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  local_750.buffercache_size = 0;
  local_750.wal_threshold = 0x400;
  local_750.compaction_threshold = '\0';
  if (args != (void *)0x0) {
    fVar1 = fdb_open(&dbfile,"./compact_test1",&local_750);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x60f);
      db_compact_during_doc_delete(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0x60f,"void *db_compact_during_doc_delete(void *)");
    }
    fVar1 = fdb_compact(dbfile,(char *)0x0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_close(dbfile);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x611);
    db_compact_during_doc_delete(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x611,"void *db_compact_during_doc_delete(void *)");
  }
  system("rm -rf  compact_test* > errorlog.txt");
  fVar1 = fdb_open(&dbfile,"./compact_test1",&local_750);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5d0);
    db_compact_during_doc_delete(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x5d0,"void *db_compact_during_doc_delete(void *)");
  }
  fVar1 = fdb_kvs_open_default(dbfile,&db,&local_778);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
      sprintf(keybuf,"key%d",uVar2 & 0xffffffff);
      sprintf(metabuf,"meta%d",uVar2 & 0xffffffff);
      sprintf(bodybuf,"body%d",uVar2 & 0xffffffff);
      keylen = strlen(keybuf);
      metalen = strlen(metabuf);
      bodylen = strlen(bodybuf);
      fdb_doc_create((fdb_doc **)((long)apfStack_458 + lVar3),keybuf,keylen,metabuf,metalen,bodybuf,
                     bodylen);
      fdb_set(db,apfStack_458[uVar2]);
      lVar3 = lVar3 + 8;
    }
    fdb_commit(dbfile,'\0');
    fdb_get_kvs_info(db,&kvs_info);
    if (kvs_info.doc_count != 100) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x5e1);
      db_compact_during_doc_delete(void*)::__test_pass = '\x01';
      if (kvs_info.doc_count != 100) {
        __assert_fail("kvs_info.doc_count == (uint64_t)n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x5e1,"void *db_compact_during_doc_delete(void *)");
      }
    }
    for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
      fdb_del(db,apfStack_458[lVar3]);
      if (lVar3 == 0x32) {
        pthread_create(&tid,(pthread_attr_t *)0x0,db_compact_during_doc_delete,dbfile);
      }
    }
    pthread_join(tid,&thread_ret);
    fdb_commit(dbfile,'\x01');
    fdb_get_kvs_info(db,&kvs_info);
    if (kvs_info.doc_count != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x5f3);
      db_compact_during_doc_delete(void*)::__test_pass = '\x01';
      if (kvs_info.doc_count != 0) {
        __assert_fail("kvs_info.doc_count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x5f3,"void *db_compact_during_doc_delete(void *)");
      }
    }
    fdb_kvs_close(db);
    fdb_close(dbfile);
    fVar1 = fdb_open(&dbfile,"./compact_test1",&local_750);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_kvs_open_default(dbfile,&db,&local_778);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x5fb);
        db_compact_during_doc_delete(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x5fb,"void *db_compact_during_doc_delete(void *)");
      }
      fdb_get_kvs_info(db,&kvs_info);
      if (kvs_info.doc_count != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x5fe);
        db_compact_during_doc_delete(void*)::__test_pass = '\x01';
        if (kvs_info.doc_count != 0) {
          __assert_fail("kvs_info.doc_count == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x5fe,"void *db_compact_during_doc_delete(void *)");
        }
      }
      for (lVar3 = 0; lVar3 != 100; lVar3 = lVar3 + 1) {
        fdb_doc_free(apfStack_458[lVar3]);
      }
      fdb_kvs_close(db);
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"multi thread client shutdown");
      return (void *)0x0;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x5f9);
    db_compact_during_doc_delete(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x5f9,"void *db_compact_during_doc_delete(void *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x5d2);
  db_compact_during_doc_delete(void*)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x5d2,"void *db_compact_during_doc_delete(void *)");
}

Assistant:

void *db_compact_during_doc_delete(void *args)
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 100;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    thread_t tid;
    void *thread_ret;
    fdb_doc **doc = alca(fdb_doc*, n);
    char keybuf[256], metabuf[256], bodybuf[256];

    // init dbfile
    kvs_config = fdb_get_default_kvs_config();
    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" compact_test* > errorlog.txt");
        (void)r;

        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // insert documents
        for (i=0;i<n;++i){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta%d", i);
            sprintf(bodybuf, "body%d", i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }

        fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == (uint64_t)n);

        // start deleting docs
        for (i=0;i<n;++i){
            fdb_del(db, doc[i]);
            if (i == n/2){
                // compact half-way
                thread_create(&tid, db_compact_during_doc_delete, (void *)dbfile);
            }
        }

        // join compactor
        thread_join(tid, &thread_ret);

        fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

        // verify no docs remaining
        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // reopen
        fdb_kvs_close(db);
        fdb_close(dbfile);
        status = fdb_open(&dbfile, "./compact_test1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_get_kvs_info(db, &kvs_info);
        TEST_CHK(kvs_info.doc_count == 0);

        // cleanup
        for (i=0;i<n;++i){
            fdb_doc_free(doc[i]);
        }
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // compaction thread enters here //
    status = fdb_open(&dbfile, "./compact_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_compact(dbfile, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_close(dbfile);

    // shutdown
    thread_exit(0);
    return NULL;
}